

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> *
pbrt::Image::ResampleWeights
          (vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
           *__return_storage_ptr__,int oldRes,int newRes)

{
  pointer pRVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  pointer pRVar6;
  int j;
  long lVar7;
  ulong uVar8;
  long lVar9;
  Float FVar10;
  undefined1 auVar11 [16];
  allocator_type local_45;
  float local_44;
  float local_40;
  float local_3c;
  int vb;
  int va;
  
  vb = oldRes;
  va = newRes;
  if (oldRes <= newRes) {
    std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::vector
              (__return_storage_ptr__,(long)newRes,&local_45);
    local_40 = (float)oldRes;
    local_44 = (float)newRes;
    lVar9 = 4;
    for (uVar8 = 0; uVar8 != (uint)(~(newRes >> 0x1f) & newRes); uVar8 = uVar8 + 1) {
      pRVar6 = (__return_storage_ptr__->
               super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = 0;
      local_3c = (((float)(int)uVar8 + 0.5) * local_40) / local_44;
      auVar11 = ZEXT416((uint)(local_3c + -2.0 + 0.5));
      auVar11 = vroundss_avx(auVar11,auVar11,9);
      pRVar6[uVar8].firstPixel = (int)auVar11._0_4_;
      for (; pRVar1 = pRVar6 + uVar8, lVar7 != 4; lVar7 = lVar7 + 1) {
        FVar10 = WindowedSinc(((float)(pRVar1->firstPixel + (int)lVar7) + 0.5) - local_3c,2.0,2.0);
        pRVar6 = (__return_storage_ptr__->
                 super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        *(Float *)((long)pRVar6->weight + lVar7 * 4 + lVar9 + -4) = FVar10;
      }
      fVar2 = pRVar1->weight[0];
      fVar3 = pRVar1->weight[1];
      fVar4 = pRVar1->weight[2];
      fVar5 = pRVar1->weight[3];
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        *(float *)((long)pRVar6->weight + lVar7 * 4 + lVar9 + -4) =
             (1.0 / (fVar2 + fVar3 + fVar4 + fVar5)) *
             *(float *)((long)pRVar6->weight + lVar7 * 4 + lVar9 + -4);
      }
      lVar9 = lVar9 + 0x14;
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[7],char_const(&)[7],char_const(&)[7],int&,char_const(&)[7],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
             ,0xf5,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [7])"newRes",
             (char (*) [7])"oldRes",(char (*) [7])"newRes",&va,(char (*) [7])"oldRes",&vb);
}

Assistant:

std::vector<ResampleWeight> Image::ResampleWeights(int oldRes, int newRes) {
    CHECK_GE(newRes, oldRes);
    std::vector<ResampleWeight> wt(newRes);
    Float filterRadius = 2, tau = 2;
    for (int i = 0; i < newRes; ++i) {
        // Compute image resampling weights for _i_th pixel
        Float center = (i + .5f) * oldRes / newRes;
        wt[i].firstPixel = std::floor((center - filterRadius) + 0.5f);
        for (int j = 0; j < 4; ++j) {
            Float pos = wt[i].firstPixel + j + .5f;
            wt[i].weight[j] = WindowedSinc(pos - center, filterRadius, tau);
        }

        // Normalize filter weights for pixel resampling
        Float invSumWts =
            1 / (wt[i].weight[0] + wt[i].weight[1] + wt[i].weight[2] + wt[i].weight[3]);
        for (int j = 0; j < 4; ++j)
            wt[i].weight[j] *= invSumWts;
    }
    return wt;
}